

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ports.cpp
# Opt level: O0

void rtosc::map_arg_vals(rtosc_arg_val_t *av,size_t n,MetaContainer meta)

{
  char *pcVar1;
  ulong in_RSI;
  char *in_RDI;
  char *val;
  size_t i;
  char mapbuf [20];
  ulong local_40;
  undefined8 local_38;
  undefined8 local_30;
  undefined4 local_28;
  ulong local_18;
  char *local_10;
  
  local_38 = 0x2070616d;
  local_30 = 0;
  local_28 = 0;
  local_18 = in_RSI;
  local_10 = in_RDI;
  for (local_40 = 0; local_40 < local_18; local_40 = local_40 + 1) {
    if (*local_10 == 'i') {
      snprintf((char *)((long)&local_38 + 4),0x10,"%d",(ulong)*(uint *)(local_10 + 8));
      pcVar1 = Port::MetaContainer::operator[]((MetaContainer *)i,val);
      if (pcVar1 != (char *)0x0) {
        *local_10 = 'S';
        *(char **)(local_10 + 8) = pcVar1;
      }
    }
    local_10 = local_10 + 0x18;
  }
  return;
}

Assistant:

void rtosc::map_arg_vals(rtosc_arg_val_t* av, size_t n,
                         Port::MetaContainer meta)
{
    char mapbuf[20] = "map ";

    for(size_t i = 0; i < n; ++i, ++av)
    {
        if(av->type == 'i')
        {
            snprintf(mapbuf + 4, 16, "%d", av->val.i);
            const char* val = meta[mapbuf];
            if(val)
            {
                av->type = 'S';
                av->val.s = val;
            }
        }
    }
}